

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

RecyclableObject * __thiscall Js::JavascriptProxy::GetHandler(JavascriptProxy *this)

{
  bool bVar1;
  ScriptContext *scriptContext;
  RecyclableObject **ppRVar2;
  JavascriptProxy *this_local;
  
  bVar1 = IsRevoked(this);
  if (!bVar1) {
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->handler);
    return *ppRVar2;
  }
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea15,L"");
}

Assistant:

RecyclableObject* JavascriptProxy::GetHandler()
    {
        if (IsRevoked())
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u(""));
        }
        return handler;
    }